

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O2

SVInt __thiscall
slang::ast::UnbasedUnsizedIntegerLiteral::getValue(UnbasedUnsizedIntegerLiteral *this)

{
  char cVar1;
  bool isSigned;
  bitwidth_t bitWidth;
  Type *pTVar2;
  logic_error *this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  long in_RSI;
  SVInt SVar4;
  allocator<char> local_e1;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined8 uVar3;
  
  pTVar2 = not_null<const_slang::ast::Type_*>::get
                     ((not_null<const_slang::ast::Type_*> *)(in_RSI + 8));
  bitWidth = Type::getBitWidth(pTVar2);
  pTVar2 = not_null<const_slang::ast::Type_*>::get
                     ((not_null<const_slang::ast::Type_*> *)(in_RSI + 8));
  isSigned = Type::isSigned(pTVar2);
  cVar1 = *(char *)(in_RSI + 0x30);
  if (cVar1 == -0x80) {
    SVar4 = SVInt::createFillX((SVInt *)this,bitWidth,isSigned);
    uVar3 = SVar4.super_SVIntStorage._8_8_;
  }
  else if (cVar1 == '\x01') {
    SVInt::SVInt((SVInt *)this,bitWidth,0,isSigned);
    SVInt::setAllOnes((SVInt *)this);
    uVar3 = extraout_RDX_00;
  }
  else if (cVar1 == '@') {
    SVar4 = SVInt::createFillZ((SVInt *)this,bitWidth,isSigned);
    uVar3 = SVar4.super_SVIntStorage._8_8_;
  }
  else {
    if (cVar1 != '\0') {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/LiteralExpressions.cpp"
                 ,&local_e1);
      std::operator+(&local_a0,&local_c0,":");
      std::__cxx11::to_string(&local_e0,0xa8);
      std::operator+(&local_80,&local_a0,&local_e0);
      std::operator+(&local_60,&local_80,": ");
      std::operator+(&local_40,&local_60,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    SVInt::SVInt((SVInt *)this,bitWidth,0,isSigned);
    uVar3 = extraout_RDX;
  }
  SVar4.super_SVIntStorage.bitWidth = (int)uVar3;
  SVar4.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar3 >> 0x20);
  SVar4.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar3 >> 0x28);
  SVar4.super_SVIntStorage._14_2_ = (short)((ulong)uVar3 >> 0x30);
  SVar4.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar4.super_SVIntStorage;
}

Assistant:

SVInt UnbasedUnsizedIntegerLiteral::getValue() const {
    bitwidth_t width = type->getBitWidth();
    bool isSigned = type->isSigned();

    switch (value.value) {
        case 0:
            return SVInt(width, 0, isSigned);
        case 1: {
            SVInt tmp(width, 0, isSigned);
            tmp.setAllOnes();
            return tmp;
        }
        case logic_t::X_VALUE:
            return SVInt::createFillX(width, isSigned);
        case logic_t::Z_VALUE:
            return SVInt::createFillZ(width, isSigned);
        default:
            ASSUME_UNREACHABLE;
    }
}